

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_material.cpp
# Opt level: O0

float __thiscall FTexCoordInfo::TextureOffset(FTexCoordInfo *this,float textureoffset)

{
  float fVar1;
  float textureoffset_local;
  FTexCoordInfo *this_local;
  
  fVar1 = (this->mTempScale).X;
  if ((fVar1 != 1.0) || (NAN(fVar1))) {
    if ((this->mWorldPanning & 1U) == 0) {
      this_local._4_4_ = textureoffset / (this->mScale).X;
    }
    else {
      this_local._4_4_ = textureoffset / (this->mTempScale).X;
    }
  }
  else {
    fVar1 = (this->mScale).X;
    this_local._4_4_ = textureoffset;
    if (((fVar1 != 1.0) || (NAN(fVar1))) && ((this->mWorldPanning & 1U) == 0)) {
      this_local._4_4_ = textureoffset / (this->mScale).X;
    }
  }
  return this_local._4_4_;
}

Assistant:

float FTexCoordInfo::TextureOffset(float textureoffset) const
{
	if (mTempScale.X == 1.f)
	{
		if (mScale.X == 1.f || mWorldPanning) return textureoffset;
		else return textureoffset / mScale.X;
	}
	else
	{
		if (mWorldPanning) return textureoffset / mTempScale.X;
		else return textureoffset / mScale.X;
	}
}